

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeCommandListCreateImmediateEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t param_1,ze_device_handle_t param_2,
          ze_command_queue_desc_t *param_3,ze_command_list_handle_t *param_4,ze_result_t result)

{
  allocator local_59;
  string local_58 [36];
  ze_result_t local_34;
  ze_command_list_handle_t *pp_Stack_30;
  ze_result_t result_local;
  ze_command_list_handle_t *param_4_local;
  ze_command_queue_desc_t *param_3_local;
  ze_device_handle_t param_2_local;
  ze_context_handle_t param_1_local;
  ZEbasic_leakChecker *this_local;
  
  local_34 = result;
  if (result == ZE_RESULT_SUCCESS) {
    pp_Stack_30 = param_4;
    param_4_local = (ze_command_list_handle_t *)param_3;
    param_3_local = (ze_command_queue_desc_t *)param_2;
    param_2_local = (ze_device_handle_t)param_1;
    param_1_local = (ze_context_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"zeCommandListCreateImmediate",&local_59);
    countFunctionCall(this,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return local_34;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeCommandListCreateImmediateEpilogue(ze_context_handle_t, ze_device_handle_t, const ze_command_queue_desc_t*, ze_command_list_handle_t*, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeCommandListCreateImmediate");
        }
        return result;
    }